

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

string * __thiscall
flatbuffers::BaseGenerator::LastNamespacePart_abi_cxx11_
          (string *__return_storage_ptr__,BaseGenerator *this,Namespace *ns)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  if (*(long *)this == lVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(lVar1 + -0x20),
               *(long *)(lVar1 + -0x18) + *(long *)(lVar1 + -0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::LastNamespacePart(const Namespace &ns) {
  if (!ns.components.empty())
    return ns.components.back();
  else
    return std::string("");
}